

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

Ref __thiscall cashew::ValueBuilder::makeDot(ValueBuilder *this,Ref obj,IString key)

{
  Ref RVar1;
  Ref r;
  Value *pVVar2;
  undefined1 local_30 [8];
  IString key_local;
  
  key_local.str._M_len = key.str._M_len;
  local_30 = (undefined1  [8])obj.inst;
  RVar1 = makeRawArray(3);
  r = makeRawString((IString *)DOT);
  pVVar2 = cashew::Value::push_back(RVar1.inst,r);
  pVVar2 = cashew::Value::push_back(pVVar2,(Ref)this);
  RVar1 = makeRawString((IString *)local_30);
  RVar1.inst = cashew::Value::push_back(pVVar2,RVar1);
  return (Ref)RVar1.inst;
}

Assistant:

static Ref makeDot(Ref obj, IString key) {
    return &makeRawArray(3)
              ->push_back(makeRawString(DOT))
              .push_back(obj)
              .push_back(makeRawString(key));
  }